

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_ptr.hpp
# Opt level: O1

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<char_const*,void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,char *v)

{
  uint16_t val;
  void *__buf;
  container_size_overflow *this_00;
  size_t in_RCX;
  void *__buf_00;
  int __fd;
  sbuffer *this_01;
  uint uVar1;
  char buf;
  char buf_1 [2];
  char buf_2 [3];
  byte local_23 [3];
  undefined1 local_20;
  ushort local_1f;
  undefined1 local_1d;
  uint local_1c;
  
  __buf = (void *)strlen(v);
  if ((ulong)__buf >> 0x20 == 0) {
    if (__buf < (void *)0x20) {
      local_23[0] = (byte)__buf | 0xa0;
      __fd = (int)local_23;
      this_01 = o->m_stream;
      __buf_00 = (void *)0x1;
    }
    else if (__buf < (void *)0x100) {
      __fd = (int)local_23 + 1;
      local_23[1] = 0xd9;
      this_01 = o->m_stream;
      __buf_00 = (void *)0x2;
      local_23[2] = (byte)__buf;
    }
    else {
      uVar1 = (uint)__buf;
      if (__buf < (void *)0x10000) {
        __fd = (int)&local_20;
        local_20 = 0xda;
        local_1f = (ushort)__buf << 8 | (ushort)__buf >> 8;
        this_01 = o->m_stream;
        __buf_00 = (void *)0x3;
      }
      else {
        __fd = (int)&local_1d;
        local_1d = 0xdb;
        local_1c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        this_01 = o->m_stream;
        __buf_00 = (void *)0x5;
      }
    }
    sbuffer::write(this_01,__fd,__buf_00,in_RCX);
    sbuffer::write(o->m_stream,(int)v,__buf,in_RCX);
    return o;
  }
  this_00 = (container_size_overflow *)__cxa_allocate_exception(0x10);
  container_size_overflow::container_size_overflow(this_00,"container size overflow");
  __cxa_throw(this_00,&container_size_overflow::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const char* v) const {
        uint32_t size = checked_get_container_size(std::strlen(v));
        o.pack_str(size);
        o.pack_str_body(v, size);
        return o;
    }